

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Own<kj::Filesystem,_std::nullptr_t> kj::newDiskFilesystem(void)

{
  Filesystem *extraout_RDX;
  Own<kj::Filesystem,decltype(nullptr)> *in_RDI;
  Own<kj::Filesystem,_std::nullptr_t> OVar1;
  Own<kj::(anonymous_namespace)::DiskFilesystem,_std::nullptr_t> local_20;
  
  heap<kj::(anonymous_namespace)::DiskFilesystem>();
  Own<kj::Filesystem,decltype(nullptr)>::Own<kj::(anonymous_namespace)::DiskFilesystem,void>
            (in_RDI,&local_20);
  Own<kj::(anonymous_namespace)::DiskFilesystem,_std::nullptr_t>::~Own(&local_20);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)in_RDI;
  return OVar1;
}

Assistant:

Own<Filesystem> newDiskFilesystem() {
  return heap<DiskFilesystem>();
}